

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int initudpcli(SOCKET *pSock,char *address,char *port)

{
  int iVar1;
  undefined1 local_38 [8];
  sockaddr_in sa;
  char *port_local;
  char *address_local;
  SOCKET *pSock_local;
  
  sa.sin_zero = (uchar  [8])port;
  iVar1 = socket(2,2,0x11);
  *pSock = iVar1;
  if (*pSock == -1) {
    pSock_local._4_4_ = 1;
  }
  else {
    iVar1 = setsockettimeouts(*pSock,10000);
    if (iVar1 == 0) {
      memset(local_38,0,0x10);
      local_38._0_2_ = 2;
      iVar1 = atoi((char *)sa.sin_zero);
      local_38._2_2_ = htons((uint16_t)iVar1);
      local_38._4_4_ = inet_addr(address);
      iVar1 = connect(*pSock,(sockaddr *)local_38,0x10);
      if (iVar1 == 0) {
        pSock_local._4_4_ = 0;
      }
      else {
        close(*pSock);
        pSock_local._4_4_ = 1;
      }
    }
    else {
      close(*pSock);
      pSock_local._4_4_ = 1;
    }
  }
  return pSock_local._4_4_;
}

Assistant:

inline int initudpcli(SOCKET* pSock, char* address, char* port)
{
	struct sockaddr_in sa;

#ifdef _WIN32
	WSADATA wsaData;
#endif // _WIN32

#ifdef _WIN32
	// Initiate use of the Winsock 2 DLL (WS2_32.dll) by a process.
	if (WSAStartup(MAKEWORD(2,2), &wsaData) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"WSAStartup failed. ", 
			address, port));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	// Create a UDP IPv4 socket.
	*pSock = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (*pSock == INVALID_SOCKET)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"socket failed. ", 
			address, port));
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	// Configure timeouts for send and recv.
	if (setsockettimeouts(*pSock, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"setsockettimeouts failed. ", 
			address, port));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	memset(&sa, 0, sizeof(sa));

	// The sockaddr_in structure specifies the address family,
	// IP address, and port of the server to be connected to.
	sa.sin_family = AF_INET;
	sa.sin_port = htons((unsigned short)atoi(port));
	sa.sin_addr.s_addr = inet_addr(address);

//	// Associate the client to the desired address and port.
//	if (bind(*pSock, (struct sockaddr*)&sa, sizeof(sa)) != EXIT_SUCCESS)
//	{
//		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
//			strtime_m(), 
//			"bind failed. ", 
//			address, port));
//		closesocket(*pSock);
//#ifdef _WIN32
//		WSACleanup();
//#endif // _WIN32
//		return EXIT_FAILURE;
//	}

	// Connect to server.
	if (connect(*pSock, (struct sockaddr*)&sa, sizeof(sa)) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"connect failed. ", 
			address, port));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}